

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tile_common.c
# Opt level: O2

_Bool av1_get_uniform_tile_size(AV1_COMMON *cm,int *w,int *h)

{
  bool bVar1;
  int i;
  long lVar2;
  long lVar3;
  int i_1;
  int iVar4;
  
  if ((cm->tiles).uniform_spacing == 0) {
    for (lVar2 = 0; lVar2 < (cm->tiles).cols; lVar2 = lVar2 + 1) {
      iVar4 = ((cm->tiles).col_start_sb[lVar2 + 1] - (cm->tiles).col_start_sb[lVar2]) *
              cm->seq_params->mib_size;
      if ((lVar2 != 0) && (iVar4 != *w)) {
        return false;
      }
      *w = iVar4;
    }
    lVar2 = 0;
    while ((lVar3 = (long)(cm->tiles).rows, bVar1 = lVar3 <= lVar2, lVar2 < lVar3 &&
           ((iVar4 = ((cm->tiles).row_start_sb[lVar2 + 1] - (cm->tiles).row_start_sb[lVar2]) *
                     cm->seq_params->mib_size, lVar2 == 0 || (iVar4 == *h))))) {
      *h = iVar4;
      lVar2 = lVar2 + 1;
    }
  }
  else {
    *w = (cm->tiles).width;
    *h = (cm->tiles).height;
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

bool av1_get_uniform_tile_size(const AV1_COMMON *cm, int *w, int *h) {
  const CommonTileParams *const tiles = &cm->tiles;
  if (tiles->uniform_spacing) {
    *w = tiles->width;
    *h = tiles->height;
  } else {
    for (int i = 0; i < tiles->cols; ++i) {
      const int tile_width_sb =
          tiles->col_start_sb[i + 1] - tiles->col_start_sb[i];
      const int tile_w = tile_width_sb * cm->seq_params->mib_size;
      // ensure all tiles have same dimension
      if (i != 0 && tile_w != *w) {
        return false;
      }
      *w = tile_w;
    }

    for (int i = 0; i < tiles->rows; ++i) {
      const int tile_height_sb =
          tiles->row_start_sb[i + 1] - tiles->row_start_sb[i];
      const int tile_h = tile_height_sb * cm->seq_params->mib_size;
      // ensure all tiles have same dimension
      if (i != 0 && tile_h != *h) {
        return false;
      }
      *h = tile_h;
    }
  }
  return true;
}